

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O1

int wally_asset_unblind(uchar *pub_key,size_t pub_key_len,uchar *priv_key,size_t priv_key_len,
                       uchar *proof,size_t proof_len,uchar *commitment,size_t commitment_len,
                       uchar *extra,size_t extra_len,uchar *generator,size_t generator_len,
                       uchar *asset_out,size_t asset_out_len,uchar *abf_out,size_t abf_out_len,
                       uchar *vbf_out,size_t vbf_out_len,uint64_t *value_out)

{
  int iVar1;
  uchar nonce_hash [32];
  
  iVar1 = get_nonce_hash(pub_key,pub_key_len,priv_key,priv_key_len,nonce_hash,proof_len);
  if (iVar1 == 0) {
    iVar1 = wally_asset_unblind_with_nonce
                      (nonce_hash,0x20,proof,proof_len,commitment,commitment_len,extra,extra_len,
                       generator,generator_len,asset_out,asset_out_len,abf_out,abf_out_len,vbf_out,
                       vbf_out_len,value_out);
  }
  wally_clear(nonce_hash,0x20);
  return iVar1;
}

Assistant:

int wally_asset_unblind(const unsigned char *pub_key, size_t pub_key_len,
                        const unsigned char *priv_key, size_t priv_key_len,
                        const unsigned char *proof, size_t proof_len,
                        const unsigned char *commitment, size_t commitment_len,
                        const unsigned char *extra, size_t extra_len,
                        const unsigned char *generator, size_t generator_len,
                        unsigned char *asset_out, size_t asset_out_len,
                        unsigned char *abf_out, size_t abf_out_len,
                        unsigned char *vbf_out, size_t vbf_out_len,
                        uint64_t *value_out)
{
    unsigned char nonce_hash[SHA256_LEN];
    int ret;

    ret = get_nonce_hash(pub_key, pub_key_len, priv_key, priv_key_len,
                         nonce_hash, sizeof(nonce_hash));
    if (ret == WALLY_OK)
        ret = wally_asset_unblind_with_nonce(nonce_hash, sizeof(nonce_hash),
                                             proof, proof_len,
                                             commitment, commitment_len,
                                             extra, extra_len,
                                             generator, generator_len,
                                             asset_out, asset_out_len,
                                             abf_out, abf_out_len,
                                             vbf_out, vbf_out_len,
                                             value_out);

    wally_clear(nonce_hash, sizeof(nonce_hash));
    return ret;
}